

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URI.cpp
# Opt level: O0

bool stick::URI::isUnreservedChar(char _c)

{
  undefined1 local_9;
  char _c_local;
  
  if (((((_c < 'a') || ('z' < _c)) && ((_c < 'A' || ('Z' < _c)))) &&
      ((((_c < '0' || ('9' < _c)) && (_c != '-')) && ((_c != '_' && (_c != '.')))))) && (_c != '~'))
  {
    local_9 = false;
  }
  else {
    local_9 = true;
  }
  return local_9;
}

Assistant:

bool URI::isUnreservedChar(char _c)
{
    // see 2.3.  Unreserved Characters
    if ((_c >= 'a' && _c <= 'z') || (_c >= 'A' && _c <= 'Z') || (_c >= '0' && _c <= '9') ||
        _c == '-' || _c == '_' || _c == '.' || _c == '~')
        return true;
    else
        return false;
}